

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O1

UA_StatusCode
UA_Subscription_removeRetransmissionMessage(UA_Subscription *sub,UA_UInt32 sequenceNumber)

{
  UA_NotificationMessageEntry *pUVar1;
  UA_NotificationMessageEntry *pUVar2;
  UA_NotificationMessageEntry *__ptr;
  
  pUVar1 = (sub->retransmissionQueue).tqh_first;
  do {
    __ptr = pUVar1;
    if (__ptr == (UA_NotificationMessageEntry *)0x0) {
      return 0x807a0000;
    }
    pUVar1 = (__ptr->listEntry).tqe_next;
  } while ((__ptr->message).sequenceNumber != sequenceNumber);
  pUVar2 = pUVar1;
  if (pUVar1 == (UA_NotificationMessageEntry *)0x0) {
    pUVar2 = (UA_NotificationMessageEntry *)&sub->retransmissionQueue;
  }
  (pUVar2->listEntry).tqe_prev = (__ptr->listEntry).tqe_prev;
  *(__ptr->listEntry).tqe_prev = pUVar1;
  sub->retransmissionQueueSize = sub->retransmissionQueueSize - 1;
  deleteMembers_noInit(&__ptr->message,UA_TYPES + 0x22);
  (__ptr->message).notificationDataSize = 0;
  (__ptr->message).notificationData = (UA_ExtensionObject *)0x0;
  *(undefined8 *)&__ptr->message = 0;
  (__ptr->message).publishTime = 0;
  free(__ptr);
  return 0;
}

Assistant:

UA_StatusCode
UA_Subscription_removeRetransmissionMessage(UA_Subscription *sub, UA_UInt32 sequenceNumber) {
    UA_NotificationMessageEntry *entry, *entry_tmp;
    TAILQ_FOREACH_SAFE(entry, &sub->retransmissionQueue, listEntry, entry_tmp) {
        if(entry->message.sequenceNumber != sequenceNumber)
            continue;
        TAILQ_REMOVE(&sub->retransmissionQueue, entry, listEntry);
        --sub->retransmissionQueueSize;
        UA_NotificationMessage_deleteMembers(&entry->message);
        UA_free(entry);
        return UA_STATUSCODE_GOOD;
    }
    return UA_STATUSCODE_BADSEQUENCENUMBERUNKNOWN;
}